

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__check_png_header(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  psVar1 = s->img_buffer;
  lVar3 = 0;
  do {
    if (psVar1 < s->img_buffer_end) {
LAB_00162f64:
      s->img_buffer = psVar1 + 1;
      sVar2 = *psVar1;
      psVar1 = psVar1 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar1 = s->img_buffer;
        goto LAB_00162f64;
      }
      sVar2 = '\0';
    }
    if (sVar2 != stbi__check_png_header::png_sig[lVar3]) {
      *(char **)(in_FS_OFFSET + -0x10) = "Not a PNG";
      return 0;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 8) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__check_png_header(stbi__context *s)
{
   static const stbi_uc png_sig[8] = { 137,80,78,71,13,10,26,10 };
   int i;
   for (i=0; i < 8; ++i)
      if (stbi__get8(s) != png_sig[i]) return stbi__err("bad png sig","Not a PNG");
   return 1;
}